

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O0

void chapter1::file_op(void)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  size_type sVar4;
  reference pvVar5;
  ostream *poVar6;
  iterator __first;
  iterator __last;
  int local_45c;
  undefined1 local_458 [4];
  int ix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  text;
  string word;
  long local_420;
  ofstream ofile;
  long local_210;
  ifstream ifile;
  
  std::ifstream::ifstream(&local_210,"/tmp/a.txt",8);
  bVar1 = std::ios::operator!((ios *)((long)&local_210 + *(long *)(local_210 + -0x18)));
  if ((bVar1 & 1) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Oops! Cant\'t open the input file.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  std::ofstream::ofstream(&local_420,"/tmp/a.sort.txt",0x10);
  bVar1 = std::ios::operator!((ios *)((long)&local_420 + *(long *)(local_420 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string
              ((string *)
               &text.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_458);
    while( true ) {
      piVar3 = std::operator>>((istream *)&local_210,
                               (string *)
                               &text.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_458,
                  (value_type *)
                  &text.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::operator<<((ostream *)&std::cout,"Unsorted text: \n");
    local_45c = 0;
    while( true ) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_458);
      if (sVar4 <= (ulong)(long)local_45c) break;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_458,(long)local_45c);
      poVar6 = std::operator<<((ostream *)&std::cout,(string *)pvVar5);
      std::operator<<(poVar6," ");
      local_45c = local_45c + 1;
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_458);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_458);
    std::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__last._M_current);
    std::operator<<((ostream *)&local_420,"Sorted text: \n");
    local_45c = 0;
    while( true ) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_458);
      if (sVar4 <= (ulong)(long)local_45c) break;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_458,(long)local_45c);
      poVar6 = std::operator<<((ostream *)&local_420,(string *)pvVar5);
      std::operator<<(poVar6," ");
      local_45c = local_45c + 1;
    }
    std::ostream::operator<<(&local_420,std::endl<char,std::char_traits<char>>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_458);
    std::__cxx11::string::~string
              ((string *)
               &text.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::ofstream::~ofstream(&local_420);
    std::ifstream::~ifstream(&local_210);
    return;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"Oops! Cant\'t open the output file.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void file_op() {
        ifstream ifile("/tmp/a.txt");
        if (!ifile) {
            cerr << "Oops! Cant't open the input file." << endl;
            exit(1);
        }

        ofstream ofile("/tmp/a.sort.txt");
        if (!ofile) {
            cerr << "Oops! Cant't open the output file." << endl;
            exit(1);
        }

        string word;
        vector<string> text;
        while (ifile >> word) {
            text.push_back(word);
        }

        cout << "Unsorted text: \n";

        int ix(0);
        for (; ix < text.size(); ++ix) {
            cout << text[ix] << " ";
        }
        cout << endl;

        // sort
        sort(text.begin(), text.end());

        ofile << "Sorted text: \n";
        for (ix = 0; ix < text.size(); ++ix) {
            ofile << text[ix] << " ";
        }
        ofile << endl;
    }